

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.hxx
# Opt level: O1

bool __thiscall
andres::
BinaryViewExpressionScalarFirst<andres::View<int,true,std::allocator<unsigned_long>>,int,int,andres::marray_detail::Minus<int,int,int>>
::overlaps<int,false,std::allocator<unsigned_long>>
          (BinaryViewExpressionScalarFirst<andres::View<int,true,std::allocator<unsigned_long>>,int,int,andres::marray_detail::Minus<int,int,int>>
           *this,View<int,_false,_std::allocator<unsigned_long>_> *v)

{
  View<int,_true,_std::allocator<unsigned_long>_> *this_00;
  pointer piVar1;
  pointer piVar2;
  bool bVar3;
  reference piVar4;
  reference piVar5;
  void *vDataPointer_;
  void *dataPointer_;
  
  this_00 = *(View<int,_true,_std::allocator<unsigned_long>_> **)this;
  View<int,_true,_std::allocator<unsigned_long>_>::testInvariant(this_00);
  View<int,_false,_std::allocator<unsigned_long>_>::testInvariant(v);
  piVar1 = this_00->data_;
  if ((piVar1 == (pointer)0x0) || (piVar2 = v->data_, piVar2 == (pointer)0x0)) {
    bVar3 = false;
  }
  else {
    piVar4 = View<int,_true,_std::allocator<unsigned_long>_>::operator()
                       (this_00,(this_00->geometry_).size_ - 1);
    piVar5 = View<int,_false,_std::allocator<unsigned_long>_>::operator()
                       (v,(v->geometry_).size_ - 1);
    if ((piVar2 < piVar1) || (bVar3 = true, piVar4 < piVar2)) {
      bVar3 = piVar1 <= piVar5 && piVar2 <= piVar1;
    }
  }
  return bVar3;
}

Assistant:

bool overlaps(const View<Tv, isConst, A>& v) const
            { return e_.overlaps(v); }